

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextBuildNodesFromSettings
               (ImGuiContext *ctx,ImGuiDockNodeSettings *node_settings_array,int node_settings_count
               )

{
  ImGuiID IVar1;
  uint uVar2;
  ImGuiDockNode *pIVar3;
  ImGuiDockNode *pIVar4;
  ImGuiDockNode **ppIVar5;
  ImGuiWindow *pIVar6;
  int buf_size;
  ulong uVar7;
  ulong uVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  ImVec2 IVar11;
  undefined1 auVar12 [16];
  char host_window_title [20];
  char local_48 [24];
  
  uVar8 = 0;
  uVar7 = (ulong)(uint)node_settings_count;
  if (node_settings_count < 1) {
    uVar7 = uVar8;
  }
  do {
    if (uVar7 * 0x24 - uVar8 == 0) {
      return;
    }
    IVar1 = *(ImGuiID *)((long)&node_settings_array->ID + uVar8);
    if (IVar1 != 0) {
      pIVar3 = DockContextAddNode(ctx,IVar1);
      IVar1 = *(ImGuiID *)((long)&node_settings_array->ParentNodeId + uVar8);
      if (IVar1 == 0) {
        pIVar4 = (ImGuiDockNode *)0x0;
      }
      else {
        pIVar4 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,IVar1);
      }
      pIVar3->ParentNode = pIVar4;
      auVar12 = ZEXT416(*(uint *)((long)&(node_settings_array->Pos).x + uVar8));
      auVar12 = pshuflw(auVar12,auVar12,0x60);
      IVar9.x = (float)(auVar12._0_4_ >> 0x10);
      IVar9.y = (float)(auVar12._4_4_ >> 0x10);
      pIVar3->Pos = IVar9;
      auVar12 = ZEXT416(*(uint *)((long)&(node_settings_array->Size).x + uVar8));
      auVar12 = pshuflw(auVar12,auVar12,0x60);
      IVar10.x = (float)(auVar12._0_4_ >> 0x10);
      IVar10.y = (float)(auVar12._4_4_ >> 0x10);
      pIVar3->Size = IVar10;
      auVar12 = ZEXT416(*(uint *)((long)&(node_settings_array->SizeRef).x + uVar8));
      auVar12 = pshuflw(auVar12,auVar12,0x60);
      IVar11.x = (float)(auVar12._0_4_ >> 0x10);
      IVar11.y = (float)(auVar12._4_4_ >> 0x10);
      pIVar3->SizeRef = IVar11;
      *(ushort *)&pIVar3->field_0xb8 = *(ushort *)&pIVar3->field_0xb8 & 0xfe00 | 0x49;
      if (pIVar4 != (ImGuiDockNode *)0x0) {
        if (pIVar4->ChildNodes[0] == (ImGuiDockNode *)0x0) {
          ppIVar5 = pIVar4->ChildNodes;
        }
        else {
          if (pIVar4->ChildNodes[1] != (ImGuiDockNode *)0x0) goto LAB_001321f5;
          ppIVar5 = pIVar4->ChildNodes + 1;
        }
        *ppIVar5 = pIVar3;
      }
LAB_001321f5:
      pIVar3->SelectedTabId = *(ImGuiID *)((long)&node_settings_array->SelectedWindowId + uVar8);
      pIVar3->SplitAxis = (int)(&node_settings_array->SplitAxis)[uVar8];
      uVar2 = *(uint *)((long)&node_settings_array->Flags + uVar8) & 0x61fc20;
      pIVar3->LocalFlags = pIVar3->LocalFlags | uVar2;
      pIVar4 = DockNodeGetRootNode((ImGuiDockNode *)(ulong)uVar2);
      DockNodeGetHostWindowTitle(pIVar4,local_48,buf_size);
      pIVar6 = FindWindowByName(local_48);
      pIVar3->HostWindow = pIVar6;
    }
    uVar8 = uVar8 + 0x24;
  } while( true );
}

Assistant:

static void ImGui::DockContextBuildNodesFromSettings(ImGuiContext* ctx, ImGuiDockNodeSettings* node_settings_array, int node_settings_count)
{
    // Build nodes
    for (int node_n = 0; node_n < node_settings_count; node_n++)
    {
        ImGuiDockNodeSettings* settings = &node_settings_array[node_n];
        if (settings->ID == 0)
            continue;
        ImGuiDockNode* node = DockContextAddNode(ctx, settings->ID);
        node->ParentNode = settings->ParentNodeId ? DockContextFindNodeByID(ctx, settings->ParentNodeId) : NULL;
        node->Pos = ImVec2(settings->Pos.x, settings->Pos.y);
        node->Size = ImVec2(settings->Size.x, settings->Size.y);
        node->SizeRef = ImVec2(settings->SizeRef.x, settings->SizeRef.y);
        node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_DockNode;
        if (node->ParentNode && node->ParentNode->ChildNodes[0] == NULL)
            node->ParentNode->ChildNodes[0] = node;
        else if (node->ParentNode && node->ParentNode->ChildNodes[1] == NULL)
            node->ParentNode->ChildNodes[1] = node;
        node->SelectedTabId = settings->SelectedWindowId;
        node->SplitAxis = (ImGuiAxis)settings->SplitAxis;
        node->LocalFlags |= (settings->Flags & ImGuiDockNodeFlags_SavedFlagsMask_);

        // Bind host window immediately if it already exist (in case of a rebuild)
        // This is useful as the RootWindowForTitleBarHighlight links necessary to highlight the currently focused node requires node->HostWindow to be set.
        char host_window_title[20];
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        node->HostWindow = FindWindowByName(DockNodeGetHostWindowTitle(root_node, host_window_title, IM_ARRAYSIZE(host_window_title)));
    }
}